

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O2

base_learner * topk_setup(options_i *options,vw *all)

{
  int iVar1;
  base_learner *l;
  single_learner *base;
  learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar2;
  free_ptr<topk> data;
  option_group_definition new_options;
  allocator local_162;
  allocator local_161;
  free_ptr<topk> local_160;
  string local_150 [32];
  string local_130;
  string local_110;
  option_group_definition local_f0;
  undefined1 local_b8 [112];
  bool local_48;
  
  scoped_calloc_or_throw<topk>();
  std::__cxx11::string::string((string *)&local_110,"Top K",(allocator *)local_b8);
  VW::config::option_group_definition::option_group_definition(&local_f0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"top",&local_161);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_b8,&local_130,
             &(local_160._M_t.super___uniq_ptr_impl<topk,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_topk_*,_void_(*)(void_*)>.super__Head_base<0UL,_topk_*,_false>
              ._M_head_impl)->K);
  local_48 = true;
  std::__cxx11::string::string(local_150,"top k recommendation",&local_162);
  std::__cxx11::string::_M_assign((string *)(local_b8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_f0,(typed_option<unsigned_int> *)local_b8);
  std::__cxx11::string::~string(local_150);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_b8);
  std::__cxx11::string::~string((string *)&local_130);
  (**options->_vptr_options_i)(options,&local_f0);
  std::__cxx11::string::string((string *)local_b8,"top",(allocator *)local_150);
  iVar1 = (*options->_vptr_options_i[1])(options,local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
  }
  else {
    (local_160._M_t.super___uniq_ptr_impl<topk,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_topk_*,_void_(*)(void_*)>.super__Head_base<0UL,_topk_*,_false>.
    _M_head_impl)->all = all;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::
             init_learner<topk,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,example>>
                       (&local_160,base,predict_or_learn<true>,predict_or_learn<false>);
    *(undefined8 *)(plVar2 + 0x58) = *(undefined8 *)(plVar2 + 0x18);
    *(code **)(plVar2 + 0x68) = finish_example;
    *(undefined8 *)(plVar2 + 0xb8) = *(undefined8 *)(plVar2 + 0x18);
    *(undefined8 *)(plVar2 + 0xc0) = *(undefined8 *)(plVar2 + 0x20);
    *(code **)(plVar2 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&local_f0);
  std::unique_ptr<topk,_void_(*)(void_*)>::~unique_ptr(&local_160);
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* topk_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<topk>();

  option_group_definition new_options("Top K");
  new_options.add(make_option("top", data->K).keep().help("top k recommendation"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("top"))
    return nullptr;

  data->all = &all;

  LEARNER::learner<topk, multi_ex>& l =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}